

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O2

el_action_t vi_repeat_prev_char(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  el_action_t eVar2;
  
  wVar1 = (el->el_search).chadir;
  eVar2 = cv_csearch(el,-wVar1,(el->el_search).chacha,(el->el_state).argument,
                     (int)(el->el_search).chatflg);
  (el->el_search).chadir = wVar1;
  return eVar2;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_repeat_prev_char(EditLine *el, wint_t c __attribute__((__unused__)))
{
	el_action_t r;
	int dir = el->el_search.chadir;

	r = cv_csearch(el, -dir, el->el_search.chacha,
		el->el_state.argument, el->el_search.chatflg);
	el->el_search.chadir = dir;
	return r;
}